

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool check_unconditional_trap(DisasContext_conflict10 *ctx)

{
  uint32_t uVar1;
  DisasContext_conflict10 *ctx_local;
  
  uVar1 = TO(ctx->opcode);
  if (uVar1 == 0) {
    ctx_local._7_1_ = true;
  }
  else {
    uVar1 = TO(ctx->opcode);
    if (uVar1 == 0x1f) {
      gen_exception_err(ctx,6,0x40);
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

static bool check_unconditional_trap(DisasContext *ctx)
{
    /* Trap never */
    if (TO(ctx->opcode) == 0) {
        return true;
    }
    /* Trap always */
    if (TO(ctx->opcode) == 31) {
        gen_exception_err(ctx, POWERPC_EXCP_PROGRAM, POWERPC_EXCP_TRAP);
        return true;
    }
    return false;
}